

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDA.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  char *pcVar2;
  typed_value<unsigned_int,_char> *ptVar3;
  typed_value<double,_char> *ptVar4;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar5;
  options_description *poVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  any *paVar9;
  uint *puVar10;
  double *pdVar11;
  VariationalBayesEstimatorOnLDA *this;
  ostream *poVar12;
  uint uVar13;
  uint uVar14;
  bool bVar16;
  string outputDirectory;
  string BOWFilename;
  string wordListFilename;
  string VLBTimeSeriesFilename;
  string VLBFilename;
  string betaFilename;
  string alphaFilename;
  string phiFilename;
  string thetaFilename;
  BOWFileParser parser;
  positional_options_description pd;
  options_description cmdline_options;
  options_description hidden;
  options_description opt;
  variables_map vm;
  undefined1 *local_730;
  long local_728;
  undefined1 local_720 [16];
  char **local_710;
  undefined1 local_708 [40];
  undefined1 *local_6e0;
  long local_6d8;
  undefined1 local_6d0 [16];
  undefined1 *local_6c0;
  long local_6b8;
  undefined1 local_6b0 [16];
  undefined1 *local_6a0;
  long local_698;
  undefined1 local_690 [16];
  undefined1 *local_680;
  long local_678;
  undefined1 local_670 [16];
  undefined1 *local_660;
  long local_658;
  undefined1 local_650 [16];
  undefined1 *local_640;
  long local_638;
  undefined1 local_630 [16];
  undefined1 *local_620;
  long local_618;
  undefined1 local_610 [16];
  undefined1 *local_600 [2];
  undefined1 local_5f0 [16];
  undefined1 *local_5e0 [2];
  undefined1 local_5d0 [16];
  undefined1 *local_5c0 [2];
  undefined1 local_5b0 [16];
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 *local_580 [2];
  undefined1 local_570 [16];
  undefined1 *local_560 [2];
  undefined1 local_550 [16];
  string local_540;
  string local_520;
  key_type local_500;
  undefined1 local_4e0 [80];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_490 [32];
  options_description *local_470;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  undefined1 *local_270;
  undefined1 local_260 [16];
  uint local_250;
  undefined4 uStack_24c;
  undefined1 local_240 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_228 [24];
  void *local_210;
  undefined4 local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  undefined8 local_1f0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_1e8 [24];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_1a8 [24];
  void *local_190;
  undefined4 local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined8 local_170;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_168 [24];
  undefined1 *local_150 [2];
  undefined1 local_140 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_128 [24];
  void *local_110;
  undefined4 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_e8 [24];
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  
  pcVar1 = local_4e0 + 0x10;
  local_710 = argv;
  local_4e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"Options","");
  uVar14 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar13 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(ulong)uVar13;
  boost::program_options::options_description::options_description
            ((options_description *)local_150,(string *)local_4e0,
             (uint)boost::program_options::options_description::m_default_line_length,uVar13);
  if ((pointer)local_4e0._0_8_ != pcVar1) {
    operator_delete((void *)local_4e0._0_8_);
  }
  local_d0[0] = (code *)boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d0,"help,h");
  ptVar3 = boost::program_options::value<unsigned_int>((uint *)0x0);
  local_250 = 10;
  ptVar3 = boost::program_options::typed_value<unsigned_int,_char>::default_value(ptVar3,&local_250)
  ;
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"nmtp,k",(char *)ptVar3);
  ptVar4 = boost::program_options::value<double>((double *)0x0);
  local_1d0[0] = (undefined1 *)0x3f50624dd2f1a9fc;
  ptVar4 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar4,(double *)local_1d0);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"cdrt,d",(char *)ptVar4);
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_4e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"./","");
  ptVar5 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_4e0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"otpt,o",(char *)ptVar5);
  if ((pointer)local_4e0._0_8_ != pcVar1) {
    operator_delete((void *)local_4e0._0_8_);
  }
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_288);
  boost::program_options::positional_options_description::add((char *)&local_288,0x11912c);
  local_4e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"hidden","");
  boost::program_options::options_description::options_description
            ((options_description *)local_1d0,(string *)local_4e0,uVar14,uVar13);
  if ((pointer)local_4e0._0_8_ != pcVar1) {
    operator_delete((void *)local_4e0._0_8_);
  }
  local_4e0._0_8_ = boost::program_options::options_description::add_options();
  ptVar5 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  boost::program_options::options_description_easy_init::operator()
            (local_4e0,(value_semantic *)0x11912c,(char *)ptVar5);
  boost::program_options::options_description::options_description
            ((options_description *)&local_250,uVar14,uVar13);
  poVar6 = (options_description *)
           boost::program_options::options_description::add((options_description *)&local_250);
  boost::program_options::options_description::add(poVar6);
  boost::program_options::variables_map::variables_map((variables_map *)local_d0);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_4e0,argc,local_710);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_4e0)
  ;
  local_470 = (options_description *)&local_250;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_4e0);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_708,(basic_command_line_parser<char> *)local_4e0);
  boost::program_options::store((basic_parsed_options *)local_708,(variables_map *)local_d0,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_708);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_490);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)(local_4e0 + 0x30));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4e0);
  boost::program_options::notify((variables_map *)local_d0);
  local_708._0_8_ = local_708 + 0x10;
  local_708._8_8_ = (pointer)0x0;
  local_708[0x10] = 0;
  local_730 = local_720;
  local_728 = 0;
  local_720[0] = 0;
  local_620 = local_610;
  local_618 = 0;
  local_610[0] = 0;
  local_640 = local_630;
  local_638 = 0;
  local_630[0] = 0;
  local_660 = local_650;
  local_658 = 0;
  local_650[0] = 0;
  local_680 = local_670;
  local_678 = 0;
  local_670[0] = 0;
  local_6a0 = local_690;
  local_698 = 0;
  local_690[0] = 0;
  local_6c0 = local_6b0;
  local_6b8 = 0;
  local_6b0[0] = 0;
  local_6e0 = local_6d0;
  local_6d8 = 0;
  local_6d0[0] = 0;
  local_4e0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"help","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)local_4e0);
  bVar16 = true;
  if (cVar7._M_node == &local_b8) {
    paVar15 = &local_500.field_2;
    local_500._M_dataplus._M_p = (pointer)paVar15;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"BOWfile","");
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_c0,&local_500);
    bVar16 = cVar8._M_node == cVar7._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_500._M_dataplus._M_p != paVar15) {
      operator_delete(local_500._M_dataplus._M_p);
    }
  }
  uVar14 = (uint)paVar15;
  if ((pointer)local_4e0._0_8_ != pcVar1) {
    operator_delete((void *)local_4e0._0_8_);
  }
  if (!bVar16) {
    local_4e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"BOWfile","");
    paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
    boost::any_cast<std::__cxx11::string_const&>(paVar9);
    std::__cxx11::string::_M_assign((string *)local_708);
    if ((pointer)local_4e0._0_8_ != pcVar1) {
      operator_delete((void *)local_4e0._0_8_);
    }
    local_4e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"nmtp","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_c0,(key_type *)local_4e0);
    if ((pointer)local_4e0._0_8_ != pcVar1) {
      operator_delete((void *)local_4e0._0_8_);
    }
    if (cVar7._M_node != &local_b8) {
      local_4e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"nmtp","");
      paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0)
      ;
      puVar10 = boost::any_cast<unsigned_int_const&>(paVar9);
      uVar14 = *puVar10;
      if ((pointer)local_4e0._0_8_ != pcVar1) {
        operator_delete((void *)local_4e0._0_8_);
      }
    }
    local_4e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"cdrt","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_c0,(key_type *)local_4e0);
    if ((pointer)local_4e0._0_8_ != pcVar1) {
      operator_delete((void *)local_4e0._0_8_);
    }
    if (cVar7._M_node != &local_b8) {
      local_4e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"cdrt","");
      paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0)
      ;
      pdVar11 = boost::any_cast<double_const&>(paVar9);
      local_710 = (char **)*pdVar11;
      if ((pointer)local_4e0._0_8_ != pcVar1) {
        operator_delete((void *)local_4e0._0_8_);
      }
    }
    local_4e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"otpt","");
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::find(local_c0,(key_type *)local_4e0);
    if ((pointer)local_4e0._0_8_ != pcVar1) {
      operator_delete((void *)local_4e0._0_8_);
    }
    if (cVar7._M_node != &local_b8) {
      local_4e0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"otpt","");
      paVar9 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0)
      ;
      boost::any_cast<std::__cxx11::string_const&>(paVar9);
      std::__cxx11::string::_M_assign((string *)&local_730);
      if ((pointer)local_4e0._0_8_ != pcVar1) {
        operator_delete((void *)local_4e0._0_8_);
      }
    }
    if (local_730[local_728 + -1] != '/') {
      std::__cxx11::string::push_back((char)&local_730);
    }
    local_4e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>((string *)local_4e0,local_730,local_730 + local_728);
    std::__cxx11::string::append(local_4e0);
    std::__cxx11::string::operator=((string *)&local_620,(string *)local_4e0);
    if ((pointer)local_4e0._0_8_ != pcVar1) {
      operator_delete((void *)local_4e0._0_8_);
    }
    local_4e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>((string *)local_4e0,local_730,local_730 + local_728);
    std::__cxx11::string::append(local_4e0);
    std::__cxx11::string::operator=((string *)&local_640,(string *)local_4e0);
    if ((pointer)local_4e0._0_8_ != pcVar1) {
      operator_delete((void *)local_4e0._0_8_);
    }
    local_4e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>((string *)local_4e0,local_730,local_730 + local_728);
    std::__cxx11::string::append(local_4e0);
    std::__cxx11::string::operator=((string *)&local_660,(string *)local_4e0);
    if ((pointer)local_4e0._0_8_ != pcVar1) {
      operator_delete((void *)local_4e0._0_8_);
    }
    local_4e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>((string *)local_4e0,local_730,local_730 + local_728);
    std::__cxx11::string::append(local_4e0);
    std::__cxx11::string::operator=((string *)&local_680,(string *)local_4e0);
    if ((pointer)local_4e0._0_8_ != pcVar1) {
      operator_delete((void *)local_4e0._0_8_);
    }
    local_4e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>((string *)local_4e0,local_730,local_730 + local_728);
    std::__cxx11::string::append(local_4e0);
    std::__cxx11::string::operator=((string *)(local_6b0 + 0x10),(string *)local_4e0);
    if ((pointer)local_4e0._0_8_ != pcVar1) {
      operator_delete((void *)local_4e0._0_8_);
    }
    local_4e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>((string *)local_4e0,local_730,local_730 + local_728);
    std::__cxx11::string::append(local_4e0);
    std::__cxx11::string::operator=((string *)&local_6c0,(string *)local_4e0);
    if ((pointer)local_4e0._0_8_ != pcVar1) {
      operator_delete((void *)local_4e0._0_8_);
    }
    local_4e0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>((string *)local_4e0,local_730,local_730 + local_728);
    std::__cxx11::string::append(local_4e0);
    std::__cxx11::string::operator=((string *)&local_6e0,(string *)local_4e0);
    if ((pointer)local_4e0._0_8_ != pcVar1) {
      operator_delete((void *)local_4e0._0_8_);
    }
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_520,local_708._0_8_,
               (undefined1 *)
               ((long)&(((string *)local_708._0_8_)->_M_dataplus)._M_p +
               (long)&(((string *)local_708._8_8_)->_M_dataplus)._M_p));
    BOWFileParser::BOWFileParser((BOWFileParser *)local_4e0,&local_520);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p != &local_520.field_2) {
      operator_delete(local_520._M_dataplus._M_p);
    }
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_540,local_6e0,local_6e0 + local_6d8);
    BOWFileParser::writeWordList((BOWFileParser *)local_4e0,&local_540);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p != &local_540.field_2) {
      operator_delete(local_540._M_dataplus._M_p);
    }
    this = (VariationalBayesEstimatorOnLDA *)operator_new(0x168);
    VariationalBayesEstimatorOnLDA::VariationalBayesEstimatorOnLDA
              (this,(BOWFileParser *)local_4e0,uVar14,(double)local_710);
    (*this->_vptr_VariationalBayesEstimatorOnLDA[0xd])(this);
    local_560[0] = local_550;
    std::__cxx11::string::_M_construct<char*>((string *)local_560,local_620,local_620 + local_618);
    local_580[0] = local_570;
    std::__cxx11::string::_M_construct<char*>((string *)local_580,local_640,local_640 + local_638);
    local_5a0[0] = local_590;
    std::__cxx11::string::_M_construct<char*>((string *)local_5a0,local_660,local_660 + local_658);
    local_5c0[0] = local_5b0;
    std::__cxx11::string::_M_construct<char*>((string *)local_5c0,local_680,local_680 + local_678);
    (*this->_vptr_VariationalBayesEstimatorOnLDA[0xb])(this,local_560,local_580,local_5a0,local_5c0)
    ;
    if (local_5c0[0] != local_5b0) {
      operator_delete(local_5c0[0]);
    }
    if (local_5a0[0] != local_590) {
      operator_delete(local_5a0[0]);
    }
    if (local_580[0] != local_570) {
      operator_delete(local_580[0]);
    }
    if (local_560[0] != local_550) {
      operator_delete(local_560[0]);
    }
    local_5e0[0] = local_5d0;
    std::__cxx11::string::_M_construct<char*>((string *)local_5e0,local_6a0,local_6a0 + local_698);
    local_600[0] = local_5f0;
    std::__cxx11::string::_M_construct<char*>((string *)local_600,local_6c0,local_6c0 + local_6b8);
    (*this->_vptr_VariationalBayesEstimatorOnLDA[0xc])(this,local_5e0,local_600);
    if (local_600[0] != local_5f0) {
      operator_delete(local_600[0]);
    }
    if (local_5e0[0] != local_5d0) {
      operator_delete(local_5e0[0]);
    }
    (*this->_vptr_VariationalBayesEstimatorOnLDA[1])(this);
    BOWFileParser::~BOWFileParser((BOWFileParser *)local_4e0);
    if (local_6e0 != local_6d0) {
      operator_delete(local_6e0);
    }
    if (local_6c0 != local_6b0) {
      operator_delete(local_6c0);
    }
    if (local_6a0 != local_690) {
      operator_delete(local_6a0);
    }
    if (local_680 != local_670) {
      operator_delete(local_680);
    }
    if (local_660 != local_650) {
      operator_delete(local_660);
    }
    if (local_640 != local_630) {
      operator_delete(local_640);
    }
    if (local_620 != local_610) {
      operator_delete(local_620);
    }
    if (local_730 != local_720) {
      operator_delete(local_730);
    }
    if ((pointer)local_708._0_8_ != (pointer)(local_708 + 0x10)) {
      operator_delete((void *)local_708._0_8_);
    }
    local_d0[0] = powl;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
    ::~_Rb_tree(local_c0);
    std::
    vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
    ::~vector(local_1e8);
    if (local_210 != (void *)0x0) {
      operator_delete(local_210);
      local_210 = (void *)0x0;
      local_208 = 0;
      local_200 = 0;
      local_1f8 = 0;
      local_1f0 = 0;
    }
    std::
    vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
    ::~vector(local_228);
    if ((undefined1 *)CONCAT44(uStack_24c,local_250) != local_240) {
      operator_delete((undefined1 *)CONCAT44(uStack_24c,local_250));
    }
    std::
    vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
    ::~vector(local_168);
    if (local_190 != (void *)0x0) {
      operator_delete(local_190);
      local_190 = (void *)0x0;
      local_188 = 0;
      local_180 = 0;
      local_178 = 0;
      local_170 = 0;
    }
    std::
    vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
    ::~vector(local_1a8);
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0]);
    }
    if (local_270 != local_260) {
      operator_delete(local_270);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_288);
    std::
    vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
    ::~vector(local_e8);
    if (local_110 != (void *)0x0) {
      operator_delete(local_110);
      local_110 = (void *)0x0;
      local_108 = 0;
      local_100 = 0;
      local_f8 = 0;
      local_f0 = 0;
    }
    std::
    vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
    ::~vector(local_128);
    if (local_150[0] != local_140) {
      operator_delete(local_150[0]);
    }
    return 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Usage:\n LDA [BOW file] [-options] ",0x22);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar12 = (ostream *)
            boost::program_options::operator<<
                      ((ostream *)&std::cout,(options_description *)local_150);
  std::endl<char,std::char_traits<char>>(poVar12);
  exit(1);
}

Assistant:

int main(int argc, char *argv[]){

    //Options{{{
    boost::program_options::options_description opt("Options");
    opt.add_options()
    ("help,h", "show help")
    ("nmtp,k", boost::program_options::value<unsigned int>()->default_value(10), "number of topics")
    ("cdrt,d", boost::program_options::value<double>()->default_value(0.001), "convergence ditermination rate")
    ("otpt,o", boost::program_options::value<string>()->default_value("./"), "directory name for output")
    ;

    boost::program_options::positional_options_description pd;
    pd.add("BOWfile", 1);

    boost::program_options::options_description hidden("hidden");
    hidden.add_options()
        ("BOWfile", boost::program_options::value<string>(), "hidden")
        ;
    boost::program_options::options_description cmdline_options;
    cmdline_options.add(opt).add(hidden);

    boost::program_options::variables_map vm;
    try{
        boost::program_options::store(boost::program_options::command_line_parser(argc, argv).options(cmdline_options).positional(pd).run(), vm);
    // }catch(const boost::program_options::error_with_option_name& e){
    //     cout<<e.what()<<endl;
    }catch(...){
        cout<<"Option error."<<endl;
    }
    boost::program_options::notify(vm);
    string BOWFilename;
    unsigned int K;
    double convergenceDiterminationRate;
    string outputDirectory;
    string thetaFilename;
    string phiFilename;
    string alphaFilename;
    string betaFilename;
    string VLBFilename;
    string VLBTimeSeriesFilename;
    string wordListFilename;
    if (vm.count("help") || !vm.count("BOWfile")){
        cout<<"Usage:\n LDA [BOW file] [-options] "<<endl;
        cout<<endl;
        cout<<opt<<endl;
        exit(1);
    }else{
        BOWFilename = vm["BOWfile"].as<std::string>();
        if(vm.count("nmtp"))K = vm["nmtp"].as<unsigned int>();
        if(vm.count("cdrt"))convergenceDiterminationRate = vm["cdrt"].as<double>();
        if(vm.count("otpt"))outputDirectory = vm["otpt"].as<std::string>();
        if(outputDirectory[outputDirectory.size()-1] != '/')outputDirectory.push_back('/');
        thetaFilename = outputDirectory + "theta.csv";
        phiFilename = outputDirectory + "phi.csv";
        alphaFilename = outputDirectory + "alpha.csv";
        betaFilename = outputDirectory + "beta.csv";
        VLBFilename = outputDirectory + "variationalLowerBound.csv";
        VLBTimeSeriesFilename = outputDirectory + "VLBTimeSeries.csv";
        wordListFilename = outputDirectory + "wordList.csv";
    }

    BOWFileParser parser(BOWFilename);
    parser.writeWordList(wordListFilename);
    //}}}

//estimation{{{
    VariationalBayesEstimatorOnLDA *estimator;
    estimator = new VariationalBayesEstimatorOnLDA(parser, K, convergenceDiterminationRate);
    estimator->runIteraions();
    estimator->writeParameter(thetaFilename, phiFilename, alphaFilename, betaFilename);
    estimator->writeVariationalLowerBound(VLBFilename, VLBTimeSeriesFilename);
    delete estimator;
//}}}
    return 0;
}